

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

bool __thiscall Clasp::ClaspBerkmin::hasTopUnsat(ClaspBerkmin *this,Solver *s)

{
  LitVec *other;
  LitVec *this_00;
  Constraint *pCVar1;
  undefined4 in_EAX;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  undefined8 uStack_38;
  
  uVar4 = (s->learnts_).ebo_.size;
  uVar3 = this->topConflict_;
  if (uVar4 <= this->topConflict_) {
    uVar3 = uVar4;
  }
  this->topConflict_ = uVar3;
  if (this->topOther_ < uVar4) {
    uVar4 = this->topOther_;
  }
  this->topOther_ = uVar4;
  (this->freeOtherLits_).ebo_.size = 0;
  other = &this->freeOtherLits_;
  (this->freeLits_).ebo_.size = 0;
  this_00 = &this->freeLits_;
  uStack_38._4_4_ = (this->types_).m;
  uStack_38._0_4_ = in_EAX;
  if (1 < uStack_38._4_4_) {
    while (uVar3 < uVar4) {
      pCVar1 = (s->learnts_).ebo_.buf[uVar4 - 1];
      iVar2 = (*pCVar1->_vptr_Constraint[0xf])(pCVar1,s,(long)&uStack_38 + 4);
      if (iVar2 != 0) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap(this_00,other);
        uVar3 = this->topConflict_;
        uStack_38._4_4_ = 0;
        break;
      }
      uVar3 = this->topConflict_;
      uVar4 = this->topOther_ - 1;
      this->topOther_ = uVar4;
      (this->freeLits_).ebo_.size = 0;
    }
  }
  uStack_38 = CONCAT44(uStack_38._4_4_,(undefined4)uStack_38) | 0x200000000;
  uVar4 = uVar3 - this->maxBerkmin_;
  if (uVar3 < this->maxBerkmin_) {
    uVar4 = 0;
  }
  while (uVar3 != uVar4) {
    pCVar1 = (s->learnts_).ebo_.buf[uVar3 - 1];
    iVar2 = (*pCVar1->_vptr_Constraint[0xf])(pCVar1,s,(long)&uStack_38 + 4,this_00);
    if (iVar2 != 0) {
      if (iVar2 == 1) break;
      this->topOther_ = this->topConflict_;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap(this_00,other);
      uStack_38 = CONCAT44(2,(undefined4)uStack_38);
    }
    uVar3 = this->topConflict_ - 1;
    this->topConflict_ = uVar3;
    (this->freeLits_).ebo_.size = 0;
  }
  if ((this->freeOtherLits_).ebo_.size == 0) {
    this->topOther_ = this->topConflict_;
  }
  bVar5 = true;
  if ((this->freeLits_).ebo_.size == 0) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap(other,this_00);
    bVar5 = (this->freeLits_).ebo_.size != 0;
  }
  return bVar5;
}

Assistant:

bool ClaspBerkmin::hasTopUnsat(Solver& s) {
	topConflict_  = std::min(s.numLearntConstraints(), topConflict_);
	topOther_     = std::min(s.numLearntConstraints(), topOther_);
	assert(topConflict_ <= topOther_);
	freeOtherLits_.clear();
	freeLits_.clear();
	TypeSet ts = types_;
	if (ts.m > 1) {
		while (topOther_ > topConflict_) {
			if (s.getLearnt(topOther_-1).isOpen(s, ts, freeLits_) != 0) {
				freeLits_.swap(freeOtherLits_);
				ts.m = 0;
				break;
			}
			--topOther_;
			freeLits_.clear();
		}
	}
	ts.addSet(Constraint_t::Conflict);
	uint32 stopAt = topConflict_ < maxBerkmin_ ? 0 : topConflict_ - maxBerkmin_;
	while (topConflict_ != stopAt) {
		uint32 x = s.getLearnt(topConflict_-1).isOpen(s, ts, freeLits_);
		if (x != 0) {
			if (x == Constraint_t::Conflict) { break; }
			topOther_  = topConflict_;
			freeLits_.swap(freeOtherLits_);
			ts.m = 0;
			ts.addSet(Constraint_t::Conflict);
		}
		--topConflict_;
		freeLits_.clear();
	}
	if (freeOtherLits_.empty())  topOther_ = topConflict_;
	if (freeLits_.empty())      freeOtherLits_.swap(freeLits_);
	return !freeLits_.empty();
}